

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O0

Call * __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::Call::Arg<>
          (Call *__return_storage_ptr__,Call *this,string_view format)

{
  string_view format_00;
  string local_48;
  Call *local_28;
  Call *this_local;
  string_view format_local;
  
  format_00._M_str = format._M_str;
  this_local = (Call *)format._M_len;
  format_00._M_len = (size_t)format_00._M_str;
  local_28 = this;
  format_local._M_len = (size_t)format_00._M_str;
  format_local._M_str = (char *)__return_storage_ptr__;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_48,(lts_20250127 *)this_local,format_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->args,
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  Call(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Call Arg(absl::string_view format, const SubArgs&... args) && {
    this->args.emplace_back(absl::Substitute(format, args...));
    return std::move(*this);
  }